

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O0

void __thiscall
spvtools::opt::LoopPeeling::FixExitCondition
          (LoopPeeling *this,
          function<unsigned_int_(spvtools::opt::Instruction_*)> *condition_builder)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  iterator iVar1;
  bool bVar2;
  uint32_t uVar3;
  Op OVar4;
  CFG *this_00;
  Loop *pLVar5;
  BasicBlock *pBVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  reference puVar7;
  Instruction *pIVar8;
  DefUseManager *this_02;
  uint32_t local_11c;
  iterator local_118;
  undefined8 local_110;
  SmallVector<unsigned_int,_2UL> local_108;
  uint32_t local_dc;
  iterator local_d8;
  undefined8 local_d0;
  SmallVector<unsigned_int,_2UL> local_c8;
  uint32_t local_a0;
  uint local_9c;
  uint32_t to_continue_block_idx;
  undefined8 local_90;
  SmallVector<unsigned_int,_2UL> local_88;
  undefined1 local_60 [8];
  iterator insert_point;
  Instruction *exit_condition;
  BasicBlock *condition_block;
  const_iterator cStack_40;
  uint32_t id;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  uint32_t condition_block_id;
  CFG *cfg;
  function<unsigned_int_(spvtools::opt::Instruction_*)> *condition_builder_local;
  LoopPeeling *this_local;
  
  this_00 = IRContext::cfg(this->context_);
  __range2._4_4_ = 0;
  pLVar5 = GetClonedLoop(this);
  pBVar6 = Loop::GetMergeBlock(pLVar5);
  uVar3 = BasicBlock::id(pBVar6);
  this_01 = CFG::preds(this_00,uVar3);
  __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this_01);
  cStack_40 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this_01);
  while (bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffc0), uVar3 = __range2._4_4_,
        bVar2) {
    puVar7 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end2);
    uVar3 = *puVar7;
    pLVar5 = GetClonedLoop(this);
    bVar2 = Loop::IsInsideLoop(pLVar5,uVar3);
    if (bVar2) break;
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end2);
  }
  __range2._4_4_ = uVar3;
  if (__range2._4_4_ == 0) {
    __assert_fail("condition_block_id != 0 && \"2nd loop in improperly connected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp"
                  ,0x142,
                  "void spvtools::opt::LoopPeeling::FixExitCondition(const std::function<uint32_t (Instruction *)> &)"
                 );
  }
  pBVar6 = CFG::block(this_00,__range2._4_4_);
  insert_point.super_iterator.node_ = (iterator)BasicBlock::terminator(pBVar6);
  OVar4 = opt::Instruction::opcode((Instruction *)insert_point.super_iterator.node_);
  if (OVar4 == OpBranchConditional) {
    BasicBlock::tail((BasicBlock *)local_60);
    pIVar8 = BasicBlock::GetMergeInst(pBVar6);
    if (pIVar8 != (Instruction *)0x0) {
      InstructionList::iterator::operator--((iterator *)local_60);
    }
    iVar1.super_iterator.node_ = insert_point.super_iterator.node_;
    pIVar8 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator*
                       ((iterator_template<spvtools::opt::Instruction> *)local_60);
    local_9c = std::function<unsigned_int_(spvtools::opt::Instruction_*)>::operator()
                         (condition_builder,pIVar8);
    _to_continue_block_idx = &local_9c;
    local_90 = 1;
    init_list_01._M_len = 1;
    init_list_01._M_array = _to_continue_block_idx;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_88,init_list_01);
    opt::Instruction::SetInOperand((Instruction *)iVar1.super_iterator.node_,0,&local_88);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_88);
    pLVar5 = GetClonedLoop(this);
    uVar3 = opt::Instruction::GetSingleWordInOperand
                      ((Instruction *)insert_point.super_iterator.node_,1);
    bVar2 = Loop::IsInsideLoop(pLVar5,uVar3);
    iVar1 = insert_point;
    local_a0 = 2;
    if (bVar2) {
      local_a0 = 1;
    }
    local_dc = opt::Instruction::GetSingleWordInOperand
                         ((Instruction *)insert_point.super_iterator.node_,local_a0);
    local_d8 = &local_dc;
    local_d0 = 1;
    init_list_00._M_len = 1;
    init_list_00._M_array = local_d8;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_c8,init_list_00);
    opt::Instruction::SetInOperand((Instruction *)iVar1.super_iterator.node_,1,&local_c8);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_c8);
    iVar1 = insert_point;
    pLVar5 = GetClonedLoop(this);
    pBVar6 = Loop::GetMergeBlock(pLVar5);
    local_11c = BasicBlock::id(pBVar6);
    local_118 = &local_11c;
    local_110 = 1;
    init_list._M_len = 1;
    init_list._M_array = local_118;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_108,init_list);
    opt::Instruction::SetInOperand((Instruction *)iVar1.super_iterator.node_,2,&local_108);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_108);
    this_02 = IRContext::get_def_use_mgr(this->context_);
    analysis::DefUseManager::AnalyzeInstUse
              (this_02,(Instruction *)insert_point.super_iterator.node_);
    return;
  }
  __assert_fail("exit_condition->opcode() == spv::Op::OpBranchConditional",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp"
                ,0x146,
                "void spvtools::opt::LoopPeeling::FixExitCondition(const std::function<uint32_t (Instruction *)> &)"
               );
}

Assistant:

void LoopPeeling::FixExitCondition(
    const std::function<uint32_t(Instruction*)>& condition_builder) {
  CFG& cfg = *context_->cfg();

  uint32_t condition_block_id = 0;
  for (uint32_t id : cfg.preds(GetClonedLoop()->GetMergeBlock()->id())) {
    if (GetClonedLoop()->IsInsideLoop(id)) {
      condition_block_id = id;
      break;
    }
  }
  assert(condition_block_id != 0 && "2nd loop in improperly connected");

  BasicBlock* condition_block = cfg.block(condition_block_id);
  Instruction* exit_condition = condition_block->terminator();
  assert(exit_condition->opcode() == spv::Op::OpBranchConditional);
  BasicBlock::iterator insert_point = condition_block->tail();
  if (condition_block->GetMergeInst()) {
    --insert_point;
  }

  exit_condition->SetInOperand(0, {condition_builder(&*insert_point)});

  uint32_t to_continue_block_idx =
      GetClonedLoop()->IsInsideLoop(exit_condition->GetSingleWordInOperand(1))
          ? 1
          : 2;
  exit_condition->SetInOperand(
      1, {exit_condition->GetSingleWordInOperand(to_continue_block_idx)});
  exit_condition->SetInOperand(2, {GetClonedLoop()->GetMergeBlock()->id()});

  // Update def/use manager.
  context_->get_def_use_mgr()->AnalyzeInstUse(exit_condition);
}